

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectest-interp.cc
# Opt level: O1

Result __thiscall
spectest::CommandRunner::OnAssertTrapCommand(CommandRunner *this,AssertTrapCommand *command)

{
  uint32_t line_number;
  pointer pcVar1;
  Enum EVar2;
  ActionResult result;
  ActionResult local_90;
  long *local_48 [2];
  long local_38 [2];
  
  RunAction(&local_90,this,(command->super_CommandMixin<(wabt::CommandType)9>).super_Command.line,
            &command->action,Quiet);
  line_number = (command->super_CommandMixin<(wabt::CommandType)9>).super_Command.line;
  if (local_90.trap.obj_ == (Trap *)0x0) {
    PrintError(this,line_number,"expected trap: \"%s\"",(command->text)._M_dataplus._M_p);
    EVar2 = Error;
  }
  else {
    pcVar1 = ((local_90.trap.obj_)->message_)._M_dataplus._M_p;
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_48,pcVar1,pcVar1 + ((local_90.trap.obj_)->message_)._M_string_length)
    ;
    PrintError(this,line_number,"assert_trap passed: %s",local_48[0]);
    EVar2 = Ok;
    if (local_48[0] != local_38) {
      operator_delete(local_48[0],local_38[0] + 1);
      EVar2 = Ok;
    }
  }
  if (local_90.trap.obj_ != (Trap *)0x0) {
    wabt::interp::Store::DeleteRoot(local_90.trap.store_,local_90.trap.root_index_);
    local_90.trap.obj_ = (Trap *)0x0;
    local_90.trap.store_ = (Store *)0x0;
    local_90.trap.root_index_ = 0;
  }
  if (local_90.values.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.values.
                    super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.values.
                          super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_90.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_90.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_90.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_90.types.super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (Result)EVar2;
}

Assistant:

wabt::Result CommandRunner::OnAssertTrapCommand(
    const AssertTrapCommand* command) {
  ActionResult result =
      RunAction(command->line, &command->action, RunVerbosity::Quiet);
  if (!result.trap) {
    PrintError(command->line, "expected trap: \"%s\"", command->text.c_str());
    return wabt::Result::Error;
  }

  PrintError(command->line, "assert_trap passed: %s",
             result.trap->message().c_str());
  return wabt::Result::Ok;
}